

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

mbedtls_ecp_curve_info * mbedtls_ecp_curve_info_from_grp_id(mbedtls_ecp_group_id grp_id)

{
  mbedtls_ecp_curve_info *pmVar1;
  mbedtls_ecp_group_id mVar2;
  
  pmVar1 = ecp_supported_curves;
  mVar2 = MBEDTLS_ECP_DP_CURVE25519;
  do {
    if (mVar2 == grp_id) {
      return pmVar1;
    }
    mVar2 = pmVar1[1].grp_id;
    pmVar1 = pmVar1 + 1;
  } while (mVar2 != MBEDTLS_ECP_DP_NONE);
  return (mbedtls_ecp_curve_info *)0x0;
}

Assistant:

const mbedtls_ecp_curve_info *mbedtls_ecp_curve_info_from_grp_id( mbedtls_ecp_group_id grp_id )
{
    const mbedtls_ecp_curve_info *curve_info;

    for( curve_info = mbedtls_ecp_curve_list();
         curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
         curve_info++ )
    {
        if( curve_info->grp_id == grp_id )
            return( curve_info );
    }

    return( NULL );
}